

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O2

bool __thiscall flatbuffers::lobster::LobsterGenerator::generate(LobsterGenerator *this)

{
  bool bVar1;
  char *__rhs;
  Parser *pPVar2;
  pointer ppSVar3;
  pointer ppEVar4;
  pointer ppSVar5;
  string code;
  allocator<char> local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"// ",&local_a1);
  __rhs = BaseGenerator::FlatBuffersGeneratedWarning();
  std::operator+(&local_40,&local_60,__rhs);
  std::operator+(&local_a0,&local_40,"\nimport flatbuffers\n\n");
  std::__cxx11::string::append((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  pPVar2 = (this->super_BaseGenerator).parser_;
  for (ppEVar4 = (pPVar2->enums_).vec.
                 super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppEVar4 !=
      (pPVar2->enums_).vec.
      super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppEVar4 = ppEVar4 + 1) {
    GenEnum(this,*ppEVar4,&local_80);
    pPVar2 = (this->super_BaseGenerator).parser_;
  }
  for (ppSVar5 = (pPVar2->structs_).vec.
                 super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppSVar5 !=
      (pPVar2->structs_).vec.
      super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>.
      _M_impl.super__Vector_impl_data._M_finish; ppSVar5 = ppSVar5 + 1) {
    GenStructPreDecl(this,*ppSVar5,&local_80);
    pPVar2 = (this->super_BaseGenerator).parser_;
  }
  for (ppSVar3 = (pPVar2->structs_).vec.
                 super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppSVar3 != ppSVar5;
      ppSVar3 = ppSVar3 + 1) {
    GenStruct(this,*ppSVar3,&local_80);
    pPVar2 = (this->super_BaseGenerator).parser_;
    ppSVar5 = (pPVar2->structs_).vec.
              super__Vector_base<flatbuffers::StructDef_*,_std::allocator<flatbuffers::StructDef_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  BaseGenerator::GeneratedFileName
            (&local_a0,&this->super_BaseGenerator,(this->super_BaseGenerator).path_,
             (this->super_BaseGenerator).file_name_,&pPVar2->opts);
  bVar1 = SaveFile(local_a0._M_dataplus._M_p,&local_80,false);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  return bVar1;
}

Assistant:

bool generate() {
    std::string code;
    code += std::string("// ") + FlatBuffersGeneratedWarning() +
            "\nimport flatbuffers\n\n";
    for (auto it = parser_.enums_.vec.begin(); it != parser_.enums_.vec.end();
         ++it) {
      auto &enum_def = **it;
      GenEnum(enum_def, &code);
    }
    for (auto it = parser_.structs_.vec.begin();
         it != parser_.structs_.vec.end(); ++it) {
      auto &struct_def = **it;
      GenStructPreDecl(struct_def, &code);
    }
    for (auto it = parser_.structs_.vec.begin();
         it != parser_.structs_.vec.end(); ++it) {
      auto &struct_def = **it;
      GenStruct(struct_def, &code);
    }
    return SaveFile(GeneratedFileName(path_, file_name_, parser_.opts).c_str(),
                    code, false);
  }